

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.hpp
# Opt level: O2

void __thiscall limonp::Logger::~Logger(Logger *this)

{
  ostream *poVar1;
  string local_30 [32];
  
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cerr,local_30);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_30);
  if (this->level_ != 4) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    return;
  }
  abort();
}

Assistant:

~Logger() {
#ifdef LOGGING_LEVEL
     if (level_ < LOGGING_LEVEL) {
       return;
     }
#endif
    std::cerr << stream_.str() << std::endl;
    if (level_ == LL_FATAL) {
      abort();
    }
  }